

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOFileData.h
# Opt level: O0

void __thiscall Assimp::LWO::Surface::Surface(Surface *this)

{
  allocator local_1d [13];
  Surface *local_10;
  Surface *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)this);
  aiColor3D::aiColor3D(&this->mColor,0.78431,0.78431,0.78431);
  this->bDoubleSided = false;
  this->mDiffuseValue = 1.0;
  this->mSpecularValue = 0.0;
  this->mTransparency = 0.0;
  this->mGlossiness = 0.4;
  this->mLuminosity = 0.0;
  this->mColorHighlights = 0.0;
  this->mMaximumSmoothAngle = 0.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->mVCMap,"",local_1d);
  std::allocator<char>::~allocator((allocator<char> *)local_1d);
  this->mVCMapType = 0x52474241;
  std::__cxx11::list<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_>::list
            (&this->mShaders);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::list
            (&this->mColorTextures);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::list
            (&this->mDiffuseTextures);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::list
            (&this->mSpecularTextures);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::list
            (&this->mOpacityTextures);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::list
            (&this->mBumpTextures);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::list
            (&this->mGlossinessTextures);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::list
            (&this->mReflectionTextures);
  this->mIOR = 1.0;
  this->mBumpIntensity = 1.0;
  this->mWireframe = false;
  this->mAdditiveTransparency = 0.0;
  return;
}

Assistant:

Surface()
        : mColor                (0.78431f,0.78431f,0.78431f)
        , bDoubleSided          (false)
        , mDiffuseValue         (1.f)
        , mSpecularValue        (0.f)
        , mTransparency         (0.f)
        , mGlossiness           (0.4f)
        , mLuminosity           (0.f)
        , mColorHighlights      (0.f)
        , mMaximumSmoothAngle   (0.f) // 0 == not specified, no smoothing
        , mVCMap                ("")
        , mVCMapType            (AI_LWO_RGBA)
        , mIOR                  (1.f) // vakuum
        , mBumpIntensity        (1.f)
        , mWireframe            (false)
        , mAdditiveTransparency (0.f)
    {}